

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

void __thiscall InputError::InputError(InputError *this,int type,string *token)

{
  string local_40 [32];
  string *local_20;
  string *token_local;
  InputError *pIStack_10;
  int type_local;
  InputError *this_local;
  
  local_20 = token;
  token_local._4_4_ = type;
  pIStack_10 = this;
  ENerror::ENerror(&this->super_ENerror);
  (this->super_ENerror)._vptr_ENerror = (_func_int **)&PTR__InputError_0019eab8;
  if ((token_local._4_4_ < 0) || (7 < token_local._4_4_)) {
    token_local._4_4_ = 8;
  }
  (this->super_ENerror).code = InputErrorCodes[token_local._4_4_];
  std::operator+((char *)local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 InputErrorMsgs[token_local._4_4_]);
  std::__cxx11::string::operator=((string *)&(this->super_ENerror).msg,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

InputError::InputError(int type, string token)
{
    if (type < 0 || type >= UNSPECIFIED) type = UNSPECIFIED;
    code = InputErrorCodes[type];
    msg = InputErrorMsgs[type] + token;
}